

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

bool __thiscall Func::IsInPhase(Func *this,Phase tag)

{
  bool bVar1;
  Phase local_a [4];
  Phase tag_local;
  
  local_a[0] = tag;
  bVar1 = JsUtil::ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer>::Contains
                    ((ReadOnlyList<Js::Phase,_Memory::ArenaAllocator,_DefaultComparer> *)
                     &this->topFunc->currentPhases,local_a);
  return bVar1;
}

Assistant:

bool
Func::IsInPhase(Js::Phase tag)
{
    return this->GetTopFunc()->currentPhases.Contains(tag);
}